

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile.c
# Opt level: O1

void lysc_update_path(lysc_ctx *ctx,lys_module *parent_module,char *name)

{
  char *pcVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  
  if (name == (char *)0x0) {
    if (ctx->path[ctx->path_len - 1] == '}') {
      uVar2 = ctx->path_len;
      while( true ) {
        if (ctx->path[uVar2] == '=') break;
        if (ctx->path[uVar2] == '{') goto LAB_00140ecf;
        uVar2 = uVar2 - 1;
        ctx->path_len = uVar2;
      }
      ctx->path_len = uVar2 + 1;
      ctx->path[uVar2] = '}';
    }
    else {
LAB_00140ecf:
      uVar2 = ctx->path_len;
      uVar4 = (ulong)uVar2;
      if (ctx->path[uVar4] != '/') {
        do {
          uVar2 = (int)uVar4 - 1;
          uVar4 = (ulong)uVar2;
        } while (ctx->path[uVar4] != '/');
        ctx->path_len = uVar2;
      }
      if (uVar2 == 0) {
        ctx->path_len = 1;
      }
    }
    ctx->path[ctx->path_len] = '\0';
    goto LAB_00140fca;
  }
  uVar2 = ctx->path_len;
  uVar4 = (ulong)uVar2;
  if (parent_module == (lys_module *)0x0 && 1 < uVar4) {
    uVar5 = uVar2 - 1;
    if ((ctx->path[uVar5] != '}') || (ctx->path[uVar2 - 2] == '\'')) goto LAB_00140e84;
    ctx->path_len = uVar5;
    iVar3 = snprintf(ctx->path + uVar5,(ulong)(0xfef - uVar2),"=\'%s\'}",name);
  }
  else {
LAB_00140e84:
    if (parent_module == (lys_module *)0x0) {
      if ((uVar2 < 2) || (*name != '{')) goto LAB_00140f4a;
    }
    else if (ctx->cur_mod != parent_module) {
LAB_00140f4a:
      pcVar1 = "\t";
      if (1 < uVar2) {
        pcVar1 = "//";
      }
      iVar3 = snprintf(ctx->path + uVar4,(ulong)(0xfee - uVar2),"%s%s:%s",pcVar1 + 1,
                       ctx->cur_mod->name);
      goto LAB_00140f84;
    }
    pcVar1 = "\t";
    if (1 < uVar2) {
      pcVar1 = "//";
    }
    iVar3 = snprintf(ctx->path + uVar4,(ulong)(0xfee - uVar2),"%s%s",pcVar1 + 1,name);
  }
LAB_00140f84:
  if (iVar3 < (int)(0xfee - ctx->path_len)) {
    ctx->path_len = ctx->path_len + iVar3;
  }
  else {
    ctx->path_len = 0xfed;
  }
LAB_00140fca:
  ly_log_location_revert(0,0,1,0);
  ly_log_location((lysc_node *)0x0,(lyd_node *)0x0,ctx->path,(ly_in *)0x0);
  return;
}

Assistant:

void
lysc_update_path(struct lysc_ctx *ctx, const struct lys_module *parent_module, const char *name)
{
    int len;
    uint8_t nextlevel = 0; /* 0 - no starttag, 1 - '/' starttag, 2 - '=' starttag + '}' endtag */

    if (!name) {
        /* removing last path segment */
        if (ctx->path[ctx->path_len - 1] == '}') {
            for ( ; ctx->path[ctx->path_len] != '=' && ctx->path[ctx->path_len] != '{'; --ctx->path_len) {}
            if (ctx->path[ctx->path_len] == '=') {
                ctx->path[ctx->path_len++] = '}';
            } else {
                /* not a top-level special tag, remove also preceiding '/' */
                goto remove_nodelevel;
            }
        } else {
remove_nodelevel:
            for ( ; ctx->path[ctx->path_len] != '/'; --ctx->path_len) {}
            if (ctx->path_len == 0) {
                /* top-level (last segment) */
                ctx->path_len = 1;
            }
        }
        /* set new terminating NULL-byte */
        ctx->path[ctx->path_len] = '\0';
    } else {
        if (ctx->path_len > 1) {
            if (!parent_module && (ctx->path[ctx->path_len - 1] == '}') && (ctx->path[ctx->path_len - 2] != '\'')) {
                /* extension of the special tag */
                nextlevel = 2;
                --ctx->path_len;
            } else {
                /* there is already some path, so add next level */
                nextlevel = 1;
            }
        } /* else the path is just initiated with '/', so do not add additional slash in case of top-level nodes */

        if (nextlevel != 2) {
            if ((parent_module && (parent_module == ctx->cur_mod)) || (!parent_module && (ctx->path_len > 1) && (name[0] == '{'))) {
                /* module not changed, print the name unprefixed */
                len = snprintf(&ctx->path[ctx->path_len], LYSC_CTX_BUFSIZE - ctx->path_len, "%s%s",
                        nextlevel ? "/" : "", name);
            } else {
                len = snprintf(&ctx->path[ctx->path_len], LYSC_CTX_BUFSIZE - ctx->path_len, "%s%s:%s",
                        nextlevel ? "/" : "", ctx->cur_mod->name, name);
            }
        } else {
            len = snprintf(&ctx->path[ctx->path_len], LYSC_CTX_BUFSIZE - ctx->path_len, "='%s'}", name);
        }
        if (len >= LYSC_CTX_BUFSIZE - (int)ctx->path_len) {
            /* output truncated */
            ctx->path_len = LYSC_CTX_BUFSIZE - 1;
        } else {
            ctx->path_len += len;
        }
    }

    ly_log_location_revert(0, 0, 1, 0);
    ly_log_location(NULL, NULL, ctx->path, NULL);
}